

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

void __thiscall capnp::DynamicValue::Reader::Reader(Reader *this,Reader *other)

{
  Reader *other_local;
  Reader *this_local;
  
  if ((other->type < CAPABILITY) || (other->type != CAPABILITY)) {
    memcpy(this,other,0x48);
  }
  else {
    this->type = CAPABILITY;
    kj::ctor<capnp::DynamicCapability::Client,capnp::DynamicCapability::Client&>
              (&(this->field_1).capabilityValue,&(other->field_1).capabilityValue);
  }
  return;
}

Assistant:

DynamicValue::Reader::Reader(const Reader& other) {
  switch (other.type) {
    case UNKNOWN:
    case VOID:
    case BOOL:
    case INT:
    case UINT:
    case FLOAT:
    case TEXT:
    case DATA:
    case LIST:
    case ENUM:
    case STRUCT:
    case ANY_POINTER:
      KJ_ASSERT_CAN_MEMCPY(Text::Reader);
      KJ_ASSERT_CAN_MEMCPY(Data::Reader);
      KJ_ASSERT_CAN_MEMCPY(DynamicList::Reader);
      KJ_ASSERT_CAN_MEMCPY(DynamicEnum);
      KJ_ASSERT_CAN_MEMCPY(DynamicStruct::Reader);
      KJ_ASSERT_CAN_MEMCPY(AnyPointer::Reader);
      break;

    case CAPABILITY:
      type = CAPABILITY;
      kj::ctor(capabilityValue, other.capabilityValue);
      return;
  }

  memcpy(this, &other, sizeof(*this));
}